

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setPatternPartitions
          (BeagleCPUImpl<double,_1,_0> *this,int partitionCount,int *inPatternPartitions)

{
  mutex_type *pmVar1;
  uint uVar2;
  threadData *ptVar3;
  shared_future<void> *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int *piVar6;
  undefined1 auVar7 [16];
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  long *plVar12;
  int **ppiVar13;
  undefined8 *puVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong *puVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  ulong uVar21;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_58;
  threadData *local_48;
  BeagleCPUImpl<double,_1,_0> *local_40;
  thread local_38;
  
  this->kPartitionCount = partitionCount;
  if (this->kPartitionsInitialised == false) {
    piVar8 = (int *)malloc((long)this->kPatternCount << 2);
    this->gPatternPartitions = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0012168c;
    if (this->kAutoPartitioningEnabled == true) {
      free(this->gAutoPartitionOperations);
      if (this->kAutoRootPartitioningEnabled == true) {
        free(this->gAutoPartitionIndices);
        free(this->gAutoPartitionOutSumLogLikelihoods);
        this->kAutoRootPartitioningEnabled = false;
      }
      this->kAutoPartitioningEnabled = false;
    }
  }
  if ((this->kPartitionsInitialised != true) || (this->kMaxPartitionCount < partitionCount)) {
    if (this->kPartitionsInitialised != false) {
      free(this->gPatternPartitionsStartPatterns);
    }
    piVar8 = (int *)malloc((long)partitionCount * 4 + 4);
    this->gPatternPartitionsStartPatterns = piVar8;
    if (piVar8 == (int *)0x0) {
LAB_0012168c:
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = __cxa_init_primary_exception;
      __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    this->kMaxPartitionCount = partitionCount;
  }
  if (this->kThreadingEnabled == true) {
    if (0 < this->kNumThreads) {
      lVar17 = 0x58;
      lVar18 = 0;
      do {
        pmVar1 = (mutex_type *)
                 ((long)&(this->gThreads->jobs).c.
                         super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node + lVar17);
        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
        local_58._M_device = pmVar1;
        std::unique_lock<std::mutex>::lock(&local_58);
        local_58._M_owns = true;
        pmVar1[1].super___mutex_base._M_mutex.__size[0] = '\x01';
        std::condition_variable::notify_one();
        std::unique_lock<std::mutex>::~unique_lock(&local_58);
        lVar18 = lVar18 + 1;
        lVar17 = lVar17 + 0xb8;
      } while (lVar18 < this->kNumThreads);
    }
    if (0 < this->kNumThreads) {
      lVar17 = 0;
      do {
        std::thread::join();
        lVar17 = lVar17 + 1;
      } while (lVar17 < this->kNumThreads);
    }
    ptVar3 = this->gThreads;
    if (ptVar3 != (threadData *)0x0) {
      if (*(long *)&ptVar3[-1].stop != 0) {
        lVar17 = *(long *)&ptVar3[-1].stop * 0xb8;
        do {
          std::condition_variable::~condition_variable
                    ((condition_variable *)((long)ptVar3 + lVar17 + -0x60));
          std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>::
          ~deque((deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                  *)((long)ptVar3 + lVar17 + -0xb0));
          if (*(long *)((long)&ptVar3[-1].t._M_id._M_thread + lVar17) != 0) goto LAB_001216f8;
          lVar17 = lVar17 + -0xb8;
        } while (lVar17 != 0);
      }
      operator_delete__(&ptVar3[-1].stop);
    }
    psVar4 = this->gFutures;
    if (psVar4 != (shared_future<void> *)0x0) {
      p_Var5 = psVar4[-1].super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      p_Var20 = &psVar4[-1].super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        lVar17 = (long)p_Var5 << 4;
        do {
          p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    ((long)&p_Var20->_M_pi + lVar17);
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          lVar17 = lVar17 + -0x10;
        } while (lVar17 != 0);
      }
      operator_delete__(p_Var20);
    }
    if (0 < this->kNumThreads) {
      lVar17 = 0;
      do {
        free(this->gThreadOperations[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 < this->kNumThreads);
    }
    free(this->gThreadOperations);
    free(this->gThreadOpCounts);
    this->kThreadingEnabled = false;
  }
  if ((this->kFlags & 0x40000000) != 0) {
    uVar21 = (ulong)partitionCount;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar21;
    uVar9 = SUB168(auVar7 * ZEXT816(0xb8),0);
    uVar10 = uVar9 + 8;
    if (0xfffffffffffffff7 < uVar9) {
      uVar10 = 0xffffffffffffffff;
    }
    this->kNumThreads = partitionCount;
    uVar9 = 0xffffffffffffffff;
    if (SUB168(auVar7 * ZEXT816(0xb8),8) == 0) {
      uVar9 = uVar10;
    }
    puVar11 = (ulong *)operator_new__(uVar9);
    *puVar11 = uVar21;
    if (partitionCount != 0) {
      lVar17 = 0;
      puVar19 = puVar11;
      do {
        puVar19[4] = 0;
        puVar19[5] = 0;
        puVar19[6] = 0;
        puVar19[7] = 0;
        puVar19[8] = 0;
        puVar19[9] = 0;
        puVar19[10] = 0;
        puVar19[0xb] = 0;
        puVar19[1] = 0;
        puVar19[2] = 0;
        puVar19[3] = 0;
        puVar19[4] = 0;
        puVar19[5] = 0;
        puVar19[6] = 0;
        puVar19[7] = 0;
        puVar19[8] = 0;
        std::_Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
        ::_M_initialize_map((_Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                             *)(puVar19 + 2),0);
        std::condition_variable::condition_variable((condition_variable *)(puVar19 + 0xc));
        *(undefined8 *)((long)puVar19 + 0x99) = 0;
        *(undefined8 *)((long)puVar19 + 0xa1) = 0;
        *(undefined8 *)((long)puVar19 + 0xa9) = 0;
        *(undefined8 *)((long)puVar19 + 0xb1) = 0;
        puVar19[0x12] = 0;
        puVar19[0x13] = 0;
        puVar19[0x14] = 0;
        puVar19[0x15] = 0;
        lVar17 = lVar17 + -0xb8;
        puVar19 = puVar19 + 0x17;
      } while (uVar21 * -0xb8 - lVar17 != 0);
    }
    this->gThreads = (threadData *)(puVar11 + 1);
    iVar15 = this->kNumThreads;
    if (0 < iVar15) {
      lVar18 = 0;
      lVar17 = 0;
      do {
        local_58._M_device = (mutex_type *)threadWaiting;
        local_58._8_8_ = 0;
        local_48 = (threadData *)((long)&(this->gThreads->t)._M_id._M_thread + lVar18);
        local_40 = this;
        std::thread::
        thread<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*)(beagle::cpu::BeagleCPUImpl<double,1,0>::threadData*),beagle::cpu::BeagleCPUImpl<double,1,0>*,beagle::cpu::BeagleCPUImpl<double,1,0>::threadData*,void>
                  (&local_38,(offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *)&local_58,&local_40,
                   &local_48);
        if (*(long *)((long)&(this->gThreads->t)._M_id._M_thread + lVar18) != 0) {
LAB_001216f8:
          std::terminate();
        }
        ((id *)((long)&(this->gThreads->t)._M_id._M_thread + lVar18))->_M_thread =
             (native_handle_type)local_38._M_id._M_thread;
        lVar17 = lVar17 + 1;
        iVar15 = this->kNumThreads;
        lVar18 = lVar18 + 0xb8;
      } while (lVar17 < iVar15);
    }
    lVar17 = (long)iVar15;
    uVar9 = 0xffffffffffffffff;
    if (-1 < iVar15) {
      uVar9 = lVar17 * 0x10 + 8;
    }
    plVar12 = (long *)operator_new__(uVar9);
    *plVar12 = lVar17;
    if (iVar15 != 0) {
      memset((shared_future<void> *)(plVar12 + 1),0,lVar17 * 0x10);
    }
    this->gFutures = (shared_future<void> *)(plVar12 + 1);
    ppiVar13 = (int **)malloc(lVar17 * 8);
    this->gThreadOperations = ppiVar13;
    if (0 < iVar15) {
      iVar15 = *(int *)&(this->super_BeagleImpl).field_0xc;
      lVar18 = 0;
      do {
        piVar8 = (int *)malloc(uVar21 * (long)iVar15 * 0x24);
        this->gThreadOperations[lVar18] = piVar8;
        lVar18 = lVar18 + 1;
      } while (lVar17 != lVar18);
    }
    piVar8 = (int *)malloc(lVar17 << 2);
    this->gThreadOpCounts = piVar8;
    this->kThreadingEnabled = true;
  }
  memcpy(this->gPatternPartitions,inPatternPartitions,(long)this->kPatternCount << 2);
  if (0 < (long)this->kPatternCount) {
    piVar8 = this->gPatternPartitions;
    lVar17 = 0;
    iVar15 = 0;
    do {
      if (lVar17 != 0) {
        iVar15 = iVar15 + (uint)(piVar8[lVar17] != piVar8[lVar17 + -1]);
      }
      if (iVar15 != piVar8[lVar17]) {
        iVar15 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x40])(this);
        goto LAB_00121679;
      }
      lVar17 = lVar17 + 1;
    } while (this->kPatternCount != lVar17);
  }
  piVar8 = this->gPatternPartitions;
  piVar6 = this->gPatternPartitionsStartPatterns;
  iVar15 = *piVar8;
  uVar9 = (ulong)iVar15;
  piVar6[uVar9] = 0;
  iVar16 = this->kPatternCount;
  if (0 < iVar16) {
    lVar17 = 0;
    do {
      uVar2 = piVar8[lVar17];
      if (uVar2 != (uint)uVar9) {
        piVar6[(int)uVar2] = (int)lVar17;
        uVar9 = (ulong)uVar2;
      }
      iVar15 = (int)uVar9;
      lVar17 = lVar17 + 1;
      iVar16 = this->kPatternCount;
    } while (lVar17 < iVar16);
  }
  piVar6[(long)iVar15 + 1] = iVar16;
  iVar15 = 0;
LAB_00121679:
  this->kPartitionsInitialised = true;
  return iVar15;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPatternPartitions(int partitionCount,
                                                            const int* inPatternPartitions) {

    int returnCode = BEAGLE_SUCCESS;

    assert(partitionCount > 0);
    assert(inPatternPartitions != 0L);

    kPartitionCount = partitionCount;

    if (!kPartitionsInitialised) {
        gPatternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
        if (gPatternPartitions == NULL)
            throw std::bad_alloc();

        if (kAutoPartitioningEnabled) {
            free(gAutoPartitionOperations);
            if (kAutoRootPartitioningEnabled) {
                free(gAutoPartitionIndices);
                free(gAutoPartitionOutSumLogLikelihoods);
                kAutoRootPartitioningEnabled = false;
            }
            kAutoPartitioningEnabled = false;
        }
    }
    if (!kPartitionsInitialised || partitionCount > kMaxPartitionCount) {
        if (kPartitionsInitialised) {
            free(gPatternPartitionsStartPatterns);
        }
        gPatternPartitionsStartPatterns = (int*) malloc(sizeof(int) * (partitionCount+1));
        if (gPatternPartitionsStartPatterns == NULL)
            throw std::bad_alloc();

        kMaxPartitionCount = partitionCount;
    }

    if (kThreadingEnabled) {
        // Send stop signal to all threads and join them...
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            std::unique_lock<std::mutex> l(td->m);
            td->stop = true;
            td->cv.notify_one();
        }

        // Join all the threads
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            td->t.join();
        }

        delete[] gThreads;
        delete[] gFutures;

        for (int i=0; i<kNumThreads; i++) {
            free(gThreadOperations[i]);
        }
        free(gThreadOperations);
        free(gThreadOpCounts);

        kThreadingEnabled = false;
    }

    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        kNumThreads = partitionCount;

        gThreads = new threadData[kNumThreads];
        for (int i = 0; i < kNumThreads; i++) {
            gThreads[i].t = std::thread(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::threadWaiting, this, &gThreads[i]);
        }

        gFutures = new std::shared_future<void>[kNumThreads];
        if (gFutures == NULL)
            throw std::bad_alloc();

        gThreadOperations = (int**) malloc(sizeof(int*) * kNumThreads);
        for (int i=0; i<kNumThreads; i++) {
            gThreadOperations[i] = (int*) malloc(sizeof(int) * BEAGLE_PARTITION_OP_COUNT * kBufferCount * partitionCount);
        }

        gThreadOpCounts = (int*) malloc(sizeof(int) * kNumThreads);

        kThreadingEnabled = true;
    }


    memcpy(gPatternPartitions, inPatternPartitions, sizeof(int) * kPatternCount);

    bool reorderPatterns = false;
    int contiguousPartitions = 0;
    for (int i=0; i<kPatternCount; i++) {
        if (i > 0 && (gPatternPartitions[i] != gPatternPartitions[i-1])) {
            contiguousPartitions++;
        }
        if (contiguousPartitions != gPatternPartitions[i]) {
            reorderPatterns = true;
            break;
        }
    }

    if (reorderPatterns) {
        returnCode = reorderPatternsByPartition();
    } else {
        int currentPartition = gPatternPartitions[0];
        gPatternPartitionsStartPatterns[currentPartition] = 0;
        for (int i=0; i<kPatternCount; i++) {
            if (gPatternPartitions[i] != currentPartition) {
                currentPartition = gPatternPartitions[i];
                gPatternPartitionsStartPatterns[currentPartition] = i;
            }
        }
        gPatternPartitionsStartPatterns[currentPartition+1] = kPatternCount;
    }

    kPartitionsInitialised = true;

    return returnCode;
}